

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool __thiscall
duckdb::UhugeintToDecimalCast<int>
          (duckdb *this,uhugeint_t input,int *result,CastParameters *parameters,uint8_t width,
          uint8_t scale)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  uchar params_2;
  undefined3 in_register_00000089;
  uint uVar4;
  uint uVar5;
  uhugeint_t input_00;
  string error;
  uhugeint_t max_width;
  allocator local_b9;
  uhugeint_t local_b8;
  string local_a8;
  string local_88 [32];
  string local_68;
  uhugeint_t local_48;
  
  uVar4 = CONCAT31(in_register_00000089,width);
  local_b8.upper = input.lower;
  lVar3 = (((ulong)parameters & 0xffffffff) - (ulong)uVar4) * 0x10;
  local_48.lower = *(uint64_t *)(Uhugeint::POWERS_OF_TEN + lVar3);
  local_48.upper = *(uint64_t *)(Uhugeint::POWERS_OF_TEN + lVar3 + 8);
  uVar5 = uVar4;
  local_b8.lower = (uint64_t)this;
  bVar1 = uhugeint_t::operator>=(&local_b8,&local_48);
  params_2 = (uchar)uVar5;
  if (bVar1) {
    ::std::__cxx11::string::string(local_88,"Could not cast value %s to DECIMAL(%d,%d)",&local_b9);
    uhugeint_t::ToString_abi_cxx11_(&local_a8,&local_b8);
    StringUtil::Format<std::__cxx11::string,unsigned_char,unsigned_char>
              (&local_68,(StringUtil *)local_88,&local_a8,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((ulong)parameters & 0xff),width,params_2);
    ::std::__cxx11::string::~string((string *)&local_a8);
    ::std::__cxx11::string::~string(local_88);
    HandleCastError::AssignError(&local_68,(CastParameters *)result);
    ::std::__cxx11::string::~string((string *)&local_68);
  }
  else {
    input_00 = uhugeint_t::operator*
                         (&local_b8,(uhugeint_t *)(Uhugeint::POWERS_OF_TEN + (uVar4 << 4)));
    iVar2 = Uhugeint::Cast<int>(input_00);
    *(int *)input.upper = iVar2;
  }
  return !bVar1;
}

Assistant:

bool UhugeintToDecimalCast(uhugeint_t input, DST &result, CastParameters &parameters, uint8_t width, uint8_t scale) {
	// check for overflow
	uhugeint_t max_width = Uhugeint::POWERS_OF_TEN[width - scale];
	if (input >= max_width) {
		string error = StringUtil::Format("Could not cast value %s to DECIMAL(%d,%d)", input.ToString(), width, scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = Uhugeint::Cast<DST>(input * Uhugeint::POWERS_OF_TEN[scale]);
	return true;
}